

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O3

int __thiscall
Graph<unsigned_long,_scc::VectorType>::connect
          (Graph<unsigned_long,_scc::VectorType> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  pointer pNVar1;
  reference ppNVar2;
  undefined4 in_register_00000034;
  pointer local_28;
  
  pNVar1 = (this->nodes).
           super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_28 = pNVar1 + *(long *)__addr;
  std::
  vector<Graph<unsigned_long,scc::VectorType>::Node_const*,std::allocator<Graph<unsigned_long,scc::VectorType>::Node_const*>>
  ::emplace_back<Graph<unsigned_long,scc::VectorType>::Node_const*>
            ((vector<Graph<unsigned_long,scc::VectorType>::Node_const*,std::allocator<Graph<unsigned_long,scc::VectorType>::Node_const*>>
              *)&pNVar1[*(long *)CONCAT44(in_register_00000034,__fd)].edges,&local_28);
  pNVar1 = (this->nodes).
           super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_28 = pNVar1 + *(long *)CONCAT44(in_register_00000034,__fd);
  ppNVar2 = std::
            vector<Graph<unsigned_long,scc::VectorType>::Node_const*,std::allocator<Graph<unsigned_long,scc::VectorType>::Node_const*>>
            ::emplace_back<Graph<unsigned_long,scc::VectorType>::Node_const*>
                      ((vector<Graph<unsigned_long,scc::VectorType>::Node_const*,std::allocator<Graph<unsigned_long,scc::VectorType>::Node_const*>>
                        *)&pNVar1[*(long *)__addr].dual_edges,&local_28);
  return (int)ppNVar2;
}

Assistant:

void connect(const Index &x, const Index &y) {
        nodes[x].edges.push_back(&nodes[y]);
        nodes[y].dual_edges.push_back(&nodes[x]);
    }